

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::Graph(Graph *this,int t,int q,string f_file,string q_file)

{
  (this->vertices).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qualities).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qualities).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sequences).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qualities).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequences).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequences).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->treshhold = t;
  this->quality = q;
  readSequence(this);
  readQualities(this);
  createSubstrings(this);
  return;
}

Assistant:

Graph::Graph(int t, int q, string f_file, string q_file){
    this->treshhold = t;
    this->quality = q;
    this->readSequence();
    this->readQualities();
    this->createSubstrings();
}